

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

nng_err nni_http_client_init(nni_http_client **cp,nng_url *url)

{
  uint16_t uVar1;
  size_t sVar2;
  char *pcVar3;
  char *scheme;
  nng_url my_url;
  nni_http_client *c;
  nng_err rv;
  nng_url *url_local;
  nni_http_client **cp_local;
  
  scheme = nni_http_stream_scheme(url->u_scheme);
  if (scheme == (char *)0x0) {
    cp_local._4_4_ = NNG_EADDRINVAL;
  }
  else {
    memcpy(&scheme,url,200);
    sVar2 = strlen(url->u_hostname);
    if ((sVar2 == 0) || (sVar2 = strlen(url->u_hostname), 0xfd < sVar2)) {
      cp_local._4_4_ = NNG_EADDRINVAL;
    }
    else {
      my_url.u_static._120_8_ = nni_zalloc(800);
      if ((void *)my_url.u_static._120_8_ == (void *)0x0) {
        cp_local._4_4_ = NNG_ENOMEM;
      }
      else {
        nni_mtx_init((nni_mtx *)(my_url.u_static._120_8_ + 0x18));
        nni_aio_list_init((nni_list *)my_url.u_static._120_8_);
        nni_aio_init((nni_aio *)(my_url.u_static._120_8_ + 0x48),http_dial_cb,
                     (void *)my_url.u_static._120_8_);
        uVar1 = nni_url_default_port(url->u_scheme);
        if ((uint)uVar1 == url->u_port) {
          snprintf((char *)(my_url.u_static._120_8_ + 0x210),0x104,"%s",url->u_hostname);
        }
        else {
          pcVar3 = strchr(url->u_hostname,0x3a);
          if (pcVar3 == (char *)0x0) {
            snprintf((char *)(my_url.u_static._120_8_ + 0x210),0x104,"%s:%d",url->u_hostname,
                     (ulong)url->u_port);
          }
          else {
            snprintf((char *)(my_url.u_static._120_8_ + 0x210),0x104,"[%s]:%d",url->u_hostname,
                     (ulong)url->u_port);
          }
        }
        cp_local._4_4_ =
             nng_stream_dialer_alloc_url
                       ((nng_stream_dialer **)(my_url.u_static._120_8_ + 0x318),(nng_url *)&scheme);
        if (cp_local._4_4_ == NNG_OK) {
          *cp = (nni_http_client *)my_url.u_static._120_8_;
          cp_local._4_4_ = NNG_OK;
        }
        else {
          nni_http_client_fini((nni_http_client *)my_url.u_static._120_8_);
        }
      }
    }
  }
  return cp_local._4_4_;
}

Assistant:

nng_err
nni_http_client_init(nni_http_client **cp, const nng_url *url)
{
	nng_err          rv;
	nni_http_client *c;
	nng_url          my_url;
	const char      *scheme;

	if ((scheme = nni_http_stream_scheme(url->u_scheme)) == NULL) {
		return (NNG_EADDRINVAL);
	}
	// Rewrite URLs to either TLS or TCP.
	memcpy(&my_url, url, sizeof(my_url));
	my_url.u_scheme = (char *) scheme;

	if ((strlen(url->u_hostname) == 0) ||
	    (strlen(url->u_hostname) > 253)) {
		// We require a valid hostname.
		return (NNG_EADDRINVAL);
	}

	if ((c = NNI_ALLOC_STRUCT(c)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&c->mtx);
	nni_aio_list_init(&c->aios);
	nni_aio_init(&c->aio, http_dial_cb, c);

	if (nni_url_default_port(url->u_scheme) == url->u_port) {
		snprintf(c->host, sizeof(c->host), "%s", url->u_hostname);
	} else if (strchr(url->u_hostname, ':') != NULL) {
		// IPv6 address, needs [wrapping]
		snprintf(c->host, sizeof(c->host), "[%s]:%d", url->u_hostname,
		    url->u_port);
	} else {
		snprintf(c->host, sizeof(c->host), "%s:%d", url->u_hostname,
		    url->u_port);
	}
	if ((rv = nng_stream_dialer_alloc_url(&c->dialer, &my_url)) != 0) {
		nni_http_client_fini(c);
		return (rv);
	}

	*cp = c;
	return (NNG_OK);
}